

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t_backend.hpp
# Opt level: O0

number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
* std::
  numeric_limits<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>_>
  ::max(void)

{
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  representation_type local_40;
  uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  math::wide_integer::
  numeric_limits_uintwide_t_base<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::max();
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  uintwide_t_backend(&local_28,&local_40);
  boost::multiprecision::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>,(boost::multiprecision::expression_template_option)0>
  ::
  number<boost::multiprecision::uintwide_t_backend<16384u,unsigned_int,std::allocator<unsigned_int>>>
            (in_RDI,&local_28,(type *)0x0);
  boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>::
  ~uintwide_t_backend(&local_28);
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  ~uintwide_t(&local_40);
  return (number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

static constexpr auto (max)        () -> boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<MyWidth2, MyLimbType, MyAllocatorType>, ExpressionTemplatesOptions> { return boost::multiprecision::uintwide_t_backend<MyWidth2, MyLimbType, MyAllocatorType>((std::numeric_limits<::math::wide_integer::uintwide_t<MyWidth2, MyLimbType, MyAllocatorType>>::max)()       ); }